

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.h
# Opt level: O1

void __thiscall
TPZMatrixSolver<std::complex<float>_>::UpdateFrom
          (TPZMatrixSolver<std::complex<float>_> *this,TPZAutoPointer<TPZBaseMatrix> *mat_base)

{
  TPZReference *pTVar1;
  TPZMatrix<std::complex<float>_> *pTVar2;
  bool bVar3;
  TPZAutoPointer<TPZMatrix<std::complex<float>_>_> matrix;
  TPZAutoPointer<TPZBaseMatrix> local_20;
  TPZAutoPointer<TPZMatrix<std::complex<float>_>_> local_18;
  TPZAutoPointer<TPZBaseMatrix> local_10;
  
  local_10 = (TPZAutoPointer<TPZBaseMatrix>)mat_base->fRef;
  LOCK();
  ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZAutoPointerDynamicCast<TPZMatrix<std::complex<float>>,TPZBaseMatrix>(&local_20);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_10);
  pTVar1 = (this->fReferenceMatrix).fRef;
  if (pTVar1 == (TPZReference *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = pTVar1->fPointer != (TPZMatrix<std::complex<float>_> *)0x0;
  }
  if ((((local_20.fRef != (TPZReference *)0x0) &&
       (bVar3 == ((local_20.fRef)->fPointer != (TPZBaseMatrix *)0x0))) &&
      ((local_20.fRef)->fPointer != (TPZBaseMatrix *)0x0)) &&
     ((pTVar1 = (this->fContainer).fRef, pTVar1 != (TPZReference *)0x0 &&
      (pTVar1->fPointer != (TPZMatrix<std::complex<float>_> *)0x0)))) {
    pTVar2 = pTVar1->fPointer;
    local_18.fRef = (TPZReference *)local_20.fRef;
    LOCK();
    ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x35])();
    TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::~TPZAutoPointer(&local_18);
  }
  TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)&local_20);
  return;
}

Assistant:

virtual void UpdateFrom(TPZAutoPointer<TPZBaseMatrix> mat_base)
	{
        auto matrix =
            TPZAutoPointerDynamicCast<TPZMatrix<TVar>>(mat_base);
		if (fReferenceMatrix == matrix && matrix)
		{
			if(this->fContainer) this->fContainer->UpdateFrom(matrix);
		}
	}